

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase *this,Context *context,char *name,char *desc,char *varName,
          deUint32 paramName,bool isVertexCase)

{
  allocator<char> local_19;
  
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,desc,isVertexCase,evalBuiltinConstant);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_0211ec60;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_varName,varName,&local_19);
  this->m_paramName = paramName;
  return;
}

Assistant:

ShaderBuiltinConstantCase::ShaderBuiltinConstantCase (Context& context, const char* name, const char* desc, const char* varName, deUint32 paramName, bool isVertexCase)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, desc, isVertexCase, evalBuiltinConstant)
	, m_varName			(varName)
	, m_paramName		(paramName)
{
}